

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylindricalShellShape.cpp
# Opt level: O3

void __thiscall
cbtCylindricalShellShape::calculateLocalInertia
          (cbtCylindricalShellShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  ulong uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  ulong uVar5;
  
  uVar1 = *(ulong *)(this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats;
  uVar5 = uVar1;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  fVar4 = (float)uVar5;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  fVar2 = (float)uVar1 + (float)uVar5;
  auVar3 = vmovshdup_avx(auVar3);
  fVar4 = auVar3._0_4_ + fVar4;
  fVar2 = fVar2 * fVar2;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(mass * 0.25 * fVar2)),ZEXT416((uint)(mass / 12.0)),
                           ZEXT416((uint)(fVar4 * fVar4 * 4.0)));
  inertia->m_floats[0] = auVar3._0_4_;
  inertia->m_floats[1] = mass * 0.5 * fVar2;
  inertia->m_floats[2] = auVar3._0_4_;
  inertia->m_floats[3] = 0.0;
  return;
}

Assistant:

void cbtCylindricalShellShape::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const {
    // Principal axis aligned along y by default, radius in x, z-value not used

    cbtScalar radius2;                                    // square of cylinder radius
    cbtScalar height2;                                    // square of cylinder height
    cbtVector3 halfExtents = getHalfExtentsWithMargin();  // get cylinder dimension
    cbtScalar div12 = mass / 12.f;
    cbtScalar div4 = mass / 4.f;
    cbtScalar div2 = mass / 2.f;

    // cylinder is aligned along y
    int idxRadius = 0;
    int idxHeight = 1;

    // calculate squares
    radius2 = halfExtents[idxRadius] * halfExtents[idxRadius];
    height2 = cbtScalar(4.) * halfExtents[idxHeight] * halfExtents[idxHeight];

    // calculate tensor terms (cylinder is aligned along y)
    cbtScalar t1 = div12 * height2 + div4 * radius2;
    cbtScalar t2 = div2 * radius2;
    inertia.setValue(t1, t2, t1);
}